

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O1

string * __thiscall
(anonymous_namespace)::ValueToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,size_t value)

{
  bool bVar1;
  char cVar2;
  _anonymous_namespace_ *p_Var3;
  string *__str;
  char cVar4;
  
  cVar4 = '\x01';
  if ((_anonymous_namespace_ *)0x9 < this) {
    p_Var3 = this;
    cVar2 = '\x04';
    do {
      cVar4 = cVar2;
      if (p_Var3 < (_anonymous_namespace_ *)0x64) {
        cVar4 = cVar4 + -2;
        goto LAB_001ad23f;
      }
      if (p_Var3 < (_anonymous_namespace_ *)0x3e8) {
        cVar4 = cVar4 + -1;
        goto LAB_001ad23f;
      }
      if (p_Var3 < (_anonymous_namespace_ *)0x2710) goto LAB_001ad23f;
      bVar1 = (_anonymous_namespace_ *)0x1869f < p_Var3;
      p_Var3 = (_anonymous_namespace_ *)((ulong)p_Var3 / 10000);
      cVar2 = cVar4 + '\x04';
    } while (bVar1);
    cVar4 = cVar4 + '\x01';
  }
LAB_001ad23f:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((__return_storage_ptr__->_M_dataplus)._M_p,
             (uint)__return_storage_ptr__->_M_string_length,(unsigned_long)this);
  return __return_storage_ptr__;
}

Assistant:

std::string ValueToString(std::size_t const value)
{
  return std::to_string(value);
}